

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O1

GlobalPtr<int> BCL::local_malloc<int>(size_t size)

{
  ulong uVar1;
  GlobalPtr<int> GVar2;
  uint uVar3;
  ulong uVar4;
  ulong *puVar5;
  size_t sVar6;
  ulong *puVar7;
  ulong *puVar8;
  size_t sVar9;
  GlobalPtr<int> *pGVar10;
  GlobalPtr<int> GVar11;
  GlobalRef<int> GStack_18;
  
  if (bcl_finalized == '\0') {
    GStack_18.ptr_.ptr = 0x10354f;
    uVar3 = pthread_mutex_lock((pthread_mutex_t *)malloc_mutex);
    puVar7 = smem_heap;
    if (uVar3 != 0) {
      pGVar10 = (GlobalPtr<int> *)(ulong)uVar3;
      GStack_18.ptr_.ptr = (size_t)GlobalPtr<int>::operator*;
      std::__throw_system_error(uVar3);
      GlobalRef<int>::GlobalRef(&GStack_18,*pGVar10);
      GVar2.ptr = GStack_18.ptr_.ptr;
      GVar2.rank = GStack_18.ptr_.rank;
      return GVar2;
    }
    uVar4 = size * 4 + 0x3f & 0xffffffffffffffc0;
    for (puVar8 = flist; puVar8 != (ulong *)0x0; puVar8 = (ulong *)puVar8[2]) {
      uVar1 = *puVar8;
      if (uVar4 <= uVar1) {
        if (uVar4 + 0x80 < uVar1) {
          puVar7 = (ulong *)((long)puVar8 + uVar4 + 0x40);
          *puVar7 = (uVar1 - uVar4) - 0x40;
          *(ulong *)((long)puVar8 + uVar4 + 0x48) = puVar8[1];
          *(ulong *)((long)puVar8 + uVar4 + 0x50) = puVar8[2];
          if (puVar8[1] != 0) {
            *(ulong **)(puVar8[1] + 0x10) = puVar7;
          }
          if (puVar8[2] != 0) {
            *(ulong **)(puVar8[2] + 8) = puVar7;
          }
          *puVar8 = uVar4;
          puVar8[1] = 0;
          puVar8[2] = 0;
          puVar5 = smem_heap;
          if (puVar8 == flist) {
            flist = puVar7;
          }
        }
        else {
          uVar4 = puVar8[1];
          if (uVar4 != 0) {
            *(ulong *)(uVar4 + 0x10) = puVar8[2];
          }
          puVar7 = (ulong *)puVar8[2];
          if (puVar7 != (ulong *)0x0) {
            puVar7[1] = uVar4;
          }
          if (puVar8 == flist) {
            flist = puVar7;
          }
          puVar8[1] = 0;
          puVar8[2] = 0;
          puVar5 = smem_heap;
        }
        goto LAB_00103670;
      }
    }
    *smem_heap = uVar4;
    puVar5 = (ulong *)((long)puVar7 + uVar4 + 0x40);
    puVar7[1] = 0;
    puVar7[2] = 0;
    puVar8 = puVar7;
    if (puVar5 <= (ulong *)(smem_base_ptr + shared_segment_size)) {
LAB_00103670:
      smem_heap = puVar5;
      GStack_18.ptr_.ptr = 0x10367c;
      pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
      sVar9 = (long)puVar8 + (0x40 - smem_base_ptr);
      sVar6 = my_rank;
      goto LAB_0010368a;
    }
    GStack_18.ptr_.ptr = 0x1035b7;
    pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
  }
  sVar6 = 0;
  sVar9 = 0;
LAB_0010368a:
  GVar11.ptr = sVar9;
  GVar11.rank = sVar6;
  return GVar11;
}

Assistant:

inline GlobalPtr <T> local_malloc(size_t size) {
  if (bcl_finalized) {
    return nullptr;
  }
  BCL::malloc_mutex.lock();
  size = size * sizeof(T);
  // Align size
  size = ((size + SMALLEST_MEM_UNIT - 1) / SMALLEST_MEM_UNIT) * SMALLEST_MEM_UNIT;

  chunk_t *chunk = flist;

  while (chunk != NULL) {
    if (chunk->size >= size) {
      break;
    }
    chunk = chunk->next;
  }

  char *allocd = nullptr;
  if (chunk != NULL && chunk->size >= size) {
    // I have a chunk!
    if (chunk->size > SMALLEST_MEM_UNIT + size + chunk_t_size()) {
      // Chunk is too big; carve off my piece and
      // replace it with free_chunk in the flist.
      chunk_t *free_chunk = (chunk_t *) (((char *) chunk) + chunk_t_size() + size);
      free_chunk->size = chunk->size - size - chunk_t_size();
      free_chunk->last = chunk->last;
      free_chunk->next = chunk->next;
      if (chunk->last != NULL) {
        chunk->last->next = free_chunk;
      }
      if (chunk->next != NULL) {
        chunk->next->last = free_chunk;
      }
      chunk->size = size;
      chunk->next = NULL;
      chunk->last = NULL;
      if (chunk == flist) {
        flist = free_chunk;
      }
    } else {
      // Chunk is just the right size; carve it
      // off and close the hole in the flist.
      if (chunk->last != NULL) {
        chunk->last->next = chunk->next;
      }
      if (chunk->next != NULL) {
        chunk->next->last = chunk->last;
      }
      if (chunk == flist) {
        flist = chunk->next;
      }
      chunk->last = NULL;
      chunk->next = NULL;
    }
    allocd = ((char *) chunk) + chunk_t_size();
  } else {
    // No free chunk, carve one off the heap.
    chunk = BCL::smem_heap;
    chunk->size = size;
    chunk->next = NULL;
    chunk->last = NULL;
    allocd = ((char *) chunk) + chunk_t_size();
    if (allocd + size > ((char *) BCL::smem_base_ptr) + shared_segment_size) {
      BCL::malloc_mutex.unlock();
      return nullptr;
    } else {
      BCL::smem_heap = (chunk_t *) (((char *) allocd) + size);
    }
  }

  BCL::malloc_mutex.unlock();

  return GlobalPtr <T> (BCL::rank(), (uint64_t) (allocd - (char *) BCL::smem_base_ptr));
}